

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.h
# Opt level: O0

void __thiscall llvm::DWARFDebugNames::ValueIterator::setEnd(ValueIterator *this)

{
  ValueIterator local_118;
  ValueIterator *local_10;
  ValueIterator *this_local;
  
  local_118.Key.field_2._8_8_ = 0;
  local_118.Hash.Storage.field_0 =
       (anon_union_4_2_fc7899a5_for_OptionalStorage<unsigned_int,_true>_2)0x0;
  local_118.Hash.Storage.hasVal = false;
  local_118.Hash.Storage._5_3_ = 0;
  local_118.Key._M_string_length = 0;
  local_118.Key.field_2._M_allocated_capacity = 0;
  local_118.DataOffset = 0;
  local_118.Key._M_dataplus = (_Alloc_hider)0x0;
  local_118.Key._1_7_ = 0;
  local_118.CurrentEntry.Storage.field_0.value.Abbr = (Abbrev *)0x0;
  local_118.CurrentEntry.Storage.hasVal = false;
  local_118.CurrentEntry.Storage._185_7_ = 0;
  local_118.CurrentEntry.Storage.field_0._160_8_ = 0;
  local_118.CurrentEntry.Storage.field_0.value.NameIdx = (NameIndex *)0x0;
  local_118.CurrentEntry.Storage.field_0._144_8_ = 0;
  local_118.CurrentEntry.Storage.field_0._152_8_ = 0;
  local_118.CurrentEntry.Storage.field_0._128_8_ = 0;
  local_118.CurrentEntry.Storage.field_0._136_8_ = 0;
  local_118.CurrentEntry.Storage.field_0._112_8_ = 0;
  local_118.CurrentEntry.Storage.field_0._120_8_ = 0;
  local_118.CurrentEntry.Storage.field_0._96_8_ = 0;
  local_118.CurrentEntry.Storage.field_0._104_8_ = 0;
  local_118.CurrentEntry.Storage.field_0._80_8_ = 0;
  local_118.CurrentEntry.Storage.field_0._88_8_ = 0;
  local_118.CurrentEntry.Storage.field_0._64_8_ = 0;
  local_118.CurrentEntry.Storage.field_0._72_8_ = 0;
  local_118.CurrentEntry.Storage.field_0._48_8_ = 0;
  local_118.CurrentEntry.Storage.field_0._56_8_ = 0;
  local_118.CurrentEntry.Storage.field_0._32_8_ = 0;
  local_118.CurrentEntry.Storage.field_0._40_8_ = 0;
  local_118.CurrentEntry.Storage.field_0._16_8_ = 0;
  local_118.CurrentEntry.Storage.field_0._24_8_ = 0;
  local_118.CurrentEntry.Storage.field_0.value.super_Entry._vptr_Entry = (_func_int **)0x0;
  local_118.CurrentEntry.Storage.field_0.value.super_Entry.Values.
  super_SmallVectorImpl<llvm::DWARFFormValue>.
  super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
  super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX =
       (void *)0x0;
  local_118.CurrentIndex = (NameIndex *)0x0;
  local_118.IsLocal = false;
  local_118._9_7_ = 0;
  local_10 = this;
  ValueIterator(&local_118);
  operator=(this,&local_118);
  ~ValueIterator(&local_118);
  return;
}

Assistant:

void setEnd() { *this = ValueIterator(); }